

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::recalculate_max_load
          (table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
           *this)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  
  if (this->buckets_ == (bucket_pointer)0x0) {
    sVar2 = 0;
  }
  else {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,this->bucket_count_);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (double)this->mlf_ * auVar1._0_8_;
    auVar1 = vroundsd_avx(auVar4,auVar4,10);
    sVar3 = vcvttsd2usi_avx512f(auVar1);
    sVar2 = 0xffffffffffffffff;
    if (auVar1._0_8_ < 1.8446744073709552e+19) {
      sVar2 = sVar3;
    }
  }
  this->max_load_ = sVar2;
  return;
}

Assistant:

void recalculate_max_load()
        {
            using namespace std;
    
            // From 6.3.1/13:
            // Only resize when size >= mlf_ * count
            max_load_ = buckets_ ? boost::unordered::detail::double_to_size(ceil(
                    static_cast<double>(mlf_) *
                    static_cast<double>(bucket_count_)
                )) : 0;

        }